

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EnsureFncScopeSlots(ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  OpCode OVar1;
  ParseNodeFnc *pPVar2;
  ParseNodeCatch *pPVar3;
  ParseNodeBlock *pPVar4;
  ParseNodeWith *pPVar5;
  ParseNodePtr *ppPVar6;
  
  while( true ) {
    if (pnode == (ParseNode *)0x0) {
      return;
    }
    OVar1 = pnode->nop;
    if (OVar1 == knopCatch) break;
    if (OVar1 == knopBlock) {
      pPVar4 = ParseNode::AsParseNodeBlock(pnode);
      ppPVar6 = &pPVar4->pnodeNext;
      goto LAB_0076471d;
    }
    if (OVar1 == knopWith) {
      pPVar5 = ParseNode::AsParseNodeWith(pnode);
      ppPVar6 = &pPVar5->pnodeNext;
      goto LAB_0076471d;
    }
    if (OVar1 == knopFncDecl) {
      pPVar2 = ParseNode::AsParseNodeFnc(pnode);
      if ((pPVar2->fncFlags & kFunctionDeclaration) != kFunctionNone) {
        pPVar2 = ParseNode::AsParseNodeFnc(pnode);
        CheckFncDeclScopeSlot(this,pPVar2,funcInfo);
      }
      pPVar2 = ParseNode::AsParseNodeFnc(pnode);
      ppPVar6 = &pPVar2->pnodeNext;
LAB_0076471d:
      pnode = *ppPVar6;
    }
  }
  pPVar3 = ParseNode::AsParseNodeCatch(pnode);
  ppPVar6 = &pPVar3->pnodeNext;
  goto LAB_0076471d;
}

Assistant:

void ByteCodeGenerator::EnsureFncScopeSlots(ParseNode *pnode, FuncInfo *funcInfo)
{
    while (pnode)
    {
        switch (pnode->nop)
        {
        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                this->CheckFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
            }
            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;
        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;
        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;
        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;
        }
    }
}